

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::OpenPopupEx(ImGuiID id)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uint *puVar3;
  ImGuiPopupData *pIVar4;
  ImGuiID in_EDI;
  ImVec2 IVar5;
  undefined8 extraout_XMM0_Qb;
  ImGuiPopupData popup_ref;
  int current_stack_size;
  ImGuiWindow *parent_window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  ImGuiPopupData *in_stack_ffffffffffffffa0;
  ImVector<ImGuiPopupData> *this;
  ImGuiID local_50 [2];
  undefined8 local_48;
  ImGuiWindow *local_40;
  int local_38;
  uint local_34;
  ImVector<ImGuiPopupData> local_30;
  int local_1c;
  ImGuiWindow *local_18;
  ImGuiContext *local_10;
  ImGuiID local_4;
  
  local_10 = GImGui;
  local_18 = GImGui->CurrentWindow;
  local_1c = (GImGui->BeginPopupStack).Size;
  local_4 = in_EDI;
  ImGuiPopupData::ImGuiPopupData(in_stack_ffffffffffffffa0);
  local_50[0] = local_4;
  local_48 = 0;
  local_40 = local_10->NavWindow;
  local_38 = local_10->FrameCount;
  puVar3 = ImVector<unsigned_int>::back(&local_18->IDStack);
  local_34 = *puVar3;
  IVar5 = NavCalcPreferredRefPos();
  auVar1._8_8_ = extraout_XMM0_Qb;
  auVar1._0_4_ = IVar5.x;
  auVar1._4_4_ = IVar5.y;
  local_30._0_8_ = vmovlpd_avx(auVar1);
  bVar2 = IsMousePosValid(&(local_10->IO).MousePos);
  if (bVar2) {
    this = (ImVector<ImGuiPopupData> *)&(local_10->IO).MousePos;
  }
  else {
    this = &local_30;
  }
  local_30.Data = *(ImGuiPopupData **)this;
  if ((local_10->OpenPopupStack).Size < local_1c + 1) {
    ImVector<ImGuiPopupData>::push_back
              (this,(ImGuiPopupData *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98))
    ;
  }
  else {
    pIVar4 = ImVector<ImGuiPopupData>::operator[](&local_10->OpenPopupStack,local_1c);
    if ((pIVar4->PopupId == local_4) &&
       (pIVar4 = ImVector<ImGuiPopupData>::operator[](&local_10->OpenPopupStack,local_1c),
       pIVar4->OpenFrameCount == local_10->FrameCount + -1)) {
      pIVar4 = ImVector<ImGuiPopupData>::operator[](&local_10->OpenPopupStack,local_1c);
      pIVar4->OpenFrameCount = local_38;
    }
    else {
      ImVector<ImGuiPopupData>::resize(this,in_stack_ffffffffffffff9c);
      pIVar4 = ImVector<ImGuiPopupData>::operator[](&local_10->OpenPopupStack,local_1c);
      memcpy(pIVar4,local_50,0x30);
    }
  }
  return;
}

Assistant:

void ImGui::OpenPopupEx(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;
    int current_stack_size = g.BeginPopupStack.Size;
    ImGuiPopupData popup_ref; // Tagged as new ref as Window will be set back to NULL if we write this into OpenPopupStack.
    popup_ref.PopupId = id;
    popup_ref.Window = NULL;
    popup_ref.SourceWindow = g.NavWindow;
    popup_ref.OpenFrameCount = g.FrameCount;
    popup_ref.OpenParentId = parent_window->IDStack.back();
    popup_ref.OpenPopupPos = NavCalcPreferredRefPos();
    popup_ref.OpenMousePos = IsMousePosValid(&g.IO.MousePos) ? g.IO.MousePos : popup_ref.OpenPopupPos;

    //IMGUI_DEBUG_LOG("OpenPopupEx(0x%08X)\n", g.FrameCount, id);
    if (g.OpenPopupStack.Size < current_stack_size + 1)
    {
        g.OpenPopupStack.push_back(popup_ref);
    }
    else
    {
        // Gently handle the user mistakenly calling OpenPopup() every frame. It is a programming mistake! However, if we were to run the regular code path, the ui
        // would become completely unusable because the popup will always be in hidden-while-calculating-size state _while_ claiming focus. Which would be a very confusing
        // situation for the programmer. Instead, we silently allow the popup to proceed, it will keep reappearing and the programming error will be more obvious to understand.
        if (g.OpenPopupStack[current_stack_size].PopupId == id && g.OpenPopupStack[current_stack_size].OpenFrameCount == g.FrameCount - 1)
        {
            g.OpenPopupStack[current_stack_size].OpenFrameCount = popup_ref.OpenFrameCount;
        }
        else
        {
            // Close child popups if any, then flag popup for open/reopen
            g.OpenPopupStack.resize(current_stack_size + 1);
            g.OpenPopupStack[current_stack_size] = popup_ref;
        }

        // When reopening a popup we first refocus its parent, otherwise if its parent is itself a popup it would get closed by ClosePopupsOverWindow().
        // This is equivalent to what ClosePopupToLevel() does.
        //if (g.OpenPopupStack[current_stack_size].PopupId == id)
        //    FocusWindow(parent_window);
    }
}